

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O1

bool __thiscall
PrintVisitor::needParentheses(PrintVisitor *this,Expression *expression,OperatorChar op)

{
  bool bVar1;
  OperatorChar opChar;
  int iVar2;
  int iVar3;
  BinaryOperatorExpression *this_00;
  byte bVar4;
  byte bVar5;
  Operator nodeOperator;
  Operator inputOperator;
  Operator OStack_b8;
  Operator local_68;
  
  if (expression == (Expression *)0x0) {
    this_00 = (BinaryOperatorExpression *)0x0;
  }
  else {
    this_00 = (BinaryOperatorExpression *)
              __dynamic_cast(expression,&Expression::typeinfo,&BinaryOperatorExpression::typeinfo,0)
    ;
  }
  if (this_00 == (BinaryOperatorExpression *)0x0) {
    return false;
  }
  Operator::Operator(&local_68);
  Operator::Operator(&OStack_b8);
  bVar1 = CalculationEngine::getBinaryOperator(this->mCalcEngine,op,&local_68);
  if (bVar1) {
    this = (PrintVisitor *)this->mCalcEngine;
    opChar = BinaryOperatorExpression::op(this_00);
    bVar1 = CalculationEngine::getBinaryOperator((CalculationEngine *)this,opChar,&OStack_b8);
    if (bVar1) {
      iVar2 = Operator::precedence(&local_68);
      iVar3 = Operator::precedence(&OStack_b8);
      bVar4 = iVar3 < iVar2;
      bVar5 = 1;
      goto LAB_0012d43a;
    }
  }
  bVar4 = (byte)this;
  bVar5 = 0;
LAB_0012d43a:
  if (OStack_b8.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*OStack_b8.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&OStack_b8.mUnaryFn,(_Any_data *)&OStack_b8.mUnaryFn,__destroy_functor);
  }
  if (OStack_b8.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*OStack_b8.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&OStack_b8.mBinaryFn,(_Any_data *)&OStack_b8.mBinaryFn,__destroy_functor
              );
  }
  if (local_68.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_68.mUnaryFn,(_Any_data *)&local_68.mUnaryFn,__destroy_functor);
  }
  if (local_68.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_68.mBinaryFn,(_Any_data *)&local_68.mBinaryFn,__destroy_functor);
  }
  return (bool)(bVar4 & bVar5);
}

Assistant:

bool PrintVisitor::needParentheses(Expression* expression, OperatorChar op) {
	if (auto binaryOperatorExpression = dynamic_cast<BinaryOperatorExpression*>(expression)) {
		Operator inputOperator;
		Operator nodeOperator;
		if (mCalcEngine.getBinaryOperator(op, inputOperator)
			&& mCalcEngine.getBinaryOperator(binaryOperatorExpression->op(), nodeOperator)) {
			return inputOperator.precedence() > nodeOperator.precedence();
		}
	}

	return false;
}